

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void alphamapblend_quint16(int coverage,quint16 *dest,int x,quint16 srcColor)

{
  uint uVar1;
  uint uVar2;
  
  if (coverage != 0) {
    if (coverage == 0xff) {
      dest[x] = srcColor;
    }
    else {
      uVar1 = BYTE_MUL_RGB16((uint)srcColor,coverage);
      uVar2 = BYTE_MUL_RGB16((uint)dest[x],0xff - coverage);
      dest[x] = (short)uVar2 + (short)uVar1;
    }
  }
  return;
}

Assistant:

static inline void alphamapblend_quint16(int coverage, quint16 *dest, int x, const quint16 srcColor)
{
    if (coverage == 0) {
        // nothing
    } else if (coverage == 255) {
        dest[x] = srcColor;
    } else {
        dest[x] = BYTE_MUL_RGB16(srcColor, coverage)
                + BYTE_MUL_RGB16(dest[x], 255 - coverage);
    }
}